

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::grabFocus(WindowImplX11 *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long in_RDI;
  int result;
  XEvent event;
  XWindowAttributes attr;
  Atom netActiveWindow;
  undefined4 local_190 [5];
  undefined1 in_stack_fffffffffffffe87;
  string *in_stack_fffffffffffffe88;
  undefined1 local_d0 [92];
  int local_74;
  allocator local_31;
  string local_30 [32];
  Atom local_10;
  
  local_10 = 0;
  bVar1 = anon_unknown.dwarf_23372c::WindowsImplX11Impl::ewmhSupported();
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"_NET_ACTIVE_WINDOW",&local_31);
    local_10 = getAtom(in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  XGetWindowAttributes(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),local_d0);
  if (local_74 != 0) {
    if (local_10 == 0) {
      XRaiseWindow(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8));
      XSetInputFocus(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),1,0);
      XFlush(*(undefined8 *)(in_RDI + 0x3d0));
    }
    else {
      memset(local_190,0,0xc0);
      local_190[0] = 0x21;
      iVar2 = XSendEvent(*(undefined8 *)(in_RDI + 0x3d0),
                         *(undefined8 *)
                          (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
                           (long)*(int *)(*(long *)(in_RDI + 0x3d0) + 0xe0) * 0x80 + 0x10),0,
                         0x180000,local_190);
      XFlush(*(undefined8 *)(in_RDI + 0x3d0));
      if (iVar2 == 0) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Setting fullscreen failed, could not send \"_NET_ACTIVE_WINDOW\" event"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void WindowImplX11::grabFocus()
{
    using namespace WindowsImplX11Impl;

    Atom netActiveWindow = None;

    if (ewmhSupported())
        netActiveWindow = getAtom("_NET_ACTIVE_WINDOW");

    // Only try to grab focus if the window is mapped
    XWindowAttributes attr;

    XGetWindowAttributes(m_display, m_window, &attr);

    if (attr.map_state == IsUnmapped)
        return;

    if (netActiveWindow)
    {
        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netActiveWindow;
        event.xclient.data.l[0] = 1; // Normal application
        event.xclient.data.l[1] = static_cast<long>(m_lastInputTime);
        event.xclient.data.l[2] = 0; // We don't know the currently active window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        XFlush(m_display);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_ACTIVE_WINDOW\" event" << std::endl;
    }
    else
    {
        XRaiseWindow(m_display, m_window);
        XSetInputFocus(m_display, m_window, RevertToPointerRoot, CurrentTime);
        XFlush(m_display);
    }
}